

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::RaceSuccessfulPromiseNode<int>::RaceSuccessfulPromiseNode
          (RaceSuccessfulPromiseNode<int> *this,
          Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> promises,
          SourceLocation location)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *pOVar1;
  size_t sVar2;
  long *in_RSI;
  Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> local_28;
  
  (this->super_RaceSuccessfulPromiseNodeBase).super_PromiseNode.super_PromiseArenaMember.
  _vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_0062a260;
  local_28.ptr = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)*in_RSI;
  local_28.size_ = in_RSI[1];
  local_28.disposer = (ArrayDisposer *)in_RSI[2];
  *in_RSI = 0;
  in_RSI[1] = 0;
  RaceSuccessfulPromiseNodeBase::RaceSuccessfulPromiseNodeBase
            (&this->super_RaceSuccessfulPromiseNodeBase,&local_28,
             &(this->output).super_ExceptionOrValue,(SourceLocation)promises);
  sVar2 = local_28.size_;
  pOVar1 = local_28.ptr;
  if (local_28.ptr != (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)0x0) {
    local_28.ptr = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)0x0;
    local_28.size_ = 0;
    (**(local_28.disposer)->_vptr_ArrayDisposer)
              (local_28.disposer,pOVar1,8,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::
               destruct);
  }
  (this->super_RaceSuccessfulPromiseNodeBase).super_PromiseNode.super_PromiseArenaMember.
  _vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_0062a260;
  (this->output).super_ExceptionOrValue.exception.ptr.isSet = false;
  (this->output).value.ptr.isSet = false;
  return;
}

Assistant:

RaceSuccessfulPromiseNode(Array<OwnPromiseNode> promises,
                            SourceLocation location)
      : RaceSuccessfulPromiseNodeBase(kj::mv(promises), output, location) {}